

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attribute_parser.c
# Opt level: O1

uint8_t * apx_attributeParser_parse_type_attributes
                    (apx_attributeParser_t *self,uint8_t *begin,uint8_t *end,
                    apx_typeAttributes_t *attr)

{
  byte bVar1;
  bool bVar2;
  uint8_t *puVar3;
  apx_typeAttributes_t *paVar4;
  _Bool unary_minus;
  int iVar5;
  uint8_t *puVar6;
  byte *pbVar7;
  ushort **ppuVar8;
  byte *pEnd;
  adt_str_t *pElem;
  uint8_t *puVar9;
  uint8_t *pBegin;
  ushort uVar10;
  uint uVar11;
  byte *begin_00;
  uint8_t *unaff_R15;
  double d;
  apx_valueTable_t *local_a8;
  int32_t local_94;
  apx_typeAttributes_t *local_90;
  apx_attributeParser_t *local_88;
  apx_attributeParserValueTableState_t local_80;
  void **local_38;
  
  if (((end == (uint8_t *)0x0) || (begin == (uint8_t *)0x0)) || (paVar4 = attr, end < begin)) {
    if (self == (apx_attributeParser_t *)0x0) {
LAB_00123506:
      __assert_fail("self != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                    ,0x17a,
                    "void apx_attributeParser_set_error(apx_attributeParser_t *, apx_error_t, const uint8_t *)"
                   );
    }
    self->last_error = 1;
    self->error_next = begin;
    begin = (uint8_t *)0x0;
  }
  else {
    do {
      local_90 = paVar4;
      if (end <= begin) {
        return begin;
      }
      begin = bstr_lstrip(begin,end);
      if (begin == end) {
        return begin;
      }
      puVar6 = bstr_match_cstr(begin,end,"VT");
      if (begin < puVar6) {
        puVar6 = begin + 2;
        uVar11 = 1;
      }
      else {
        puVar6 = bstr_match_cstr(begin,end,"RS");
        uVar11 = (uint)(begin < puVar6) * 2;
        puVar6 = begin + uVar11;
      }
      puVar3 = puVar6;
      if (uVar11 == 2) {
        if (puVar6 < end) {
          if (*puVar6 == '(') {
            puVar9 = puVar6 + 1;
            local_80.range.lower = (anon_union_4_2_43a9a9ed_for_lower)0x0;
            local_80.range.upper = (anon_union_4_2_43a9a9ed_for_upper)0x0;
            local_80.range.is_signed_range = false;
            local_80.values.pDestructor = (_func_void_void_ptr *)0x0;
            local_80.values.ppAlloc = (void **)0x0;
            local_80.values.pFirst = (void **)0x0;
            local_80.values.s32AllocLen = 0;
            local_a8 = (apx_valueTable_t *)0x0;
            do {
              if (end <= puVar9) goto LAB_001233d5;
              pBegin = bstr_lstrip(puVar9,end);
              puVar9 = pBegin;
              if (pBegin < end) {
                local_38 = (void **)0x0;
                local_94 = 0;
                switch(local_80.values.s32AllocLen) {
                case 0:
                  puVar9 = apx_attributeParser_parse_lower_limit
                                     (pBegin + (*pBegin == '-'),end,*pBegin == '-',&local_80.range);
                  break;
                case 1:
                  puVar9 = apx_attributeParser_parse_upper_limit
                                     (pBegin + (*pBegin == '-'),end,*pBegin == '-',&local_80.range);
                  break;
                case 2:
                  puVar9 = apx_parserBase_parse_double(pBegin,end,(double *)&local_38);
                  if (pBegin < puVar9) {
                    local_80.values.ppAlloc = local_38;
                  }
                  break;
                case 3:
                  puVar9 = apx_parserBase_parse_i32(pBegin,end,&local_94);
                  if (pBegin < puVar9) {
                    local_80.values.pFirst =
                         (void **)CONCAT44(local_80.values.pFirst._4_4_,local_94);
                  }
                  break;
                case 4:
                  puVar9 = apx_parserBase_parse_i32(pBegin,end,&local_94);
                  if (pBegin < puVar9) {
                    local_80.values.pFirst =
                         (void **)CONCAT44(local_94,local_80.values.pFirst._0_4_);
                  }
                  break;
                case 5:
                  puVar9 = bstr_match_pair(pBegin,end,'\"','\"','\\');
                  if (pBegin < puVar9) {
                    local_80.values.pDestructor =
                         (_func_void_void_ptr *)bstr_make_cstr(pBegin + 1,puVar9);
                    if (local_80.values.pDestructor == (_func_void_void_ptr *)0x0) {
                      if (self != (apx_attributeParser_t *)0x0) {
                        self->last_error = 2;
                        self->error_next = pBegin;
                        puVar9 = (uint8_t *)0x0;
                        goto LAB_001232e7;
                      }
                      goto LAB_00123506;
                    }
                    puVar9 = puVar9 + 1;
                  }
                  break;
                default:
                  puVar9 = (uint8_t *)0x0;
                }
                local_80.values.s32AllocLen = local_80.values.s32AllocLen + 1;
              }
LAB_001232e7:
              if (pBegin < puVar9) {
                if (end < puVar9) {
                  __assert_fail("result <= end",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                                ,0x397,
                                "const uint8_t *apx_attributeParser_parse_rational_scaling(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_rationalScaling_t **)"
                               );
                }
                puVar9 = bstr_lstrip(puVar9,end);
                if (*puVar9 == ')') {
                  local_a8 = (apx_valueTable_t *)
                             apx_attributeParser_create_rational_scaling_from_state
                                       ((apx_attributeParserRationalScalingState_t *)&local_80);
                  if (local_80.values.pDestructor != (_func_void_void_ptr *)0x0) {
                    free(local_80.values.pDestructor);
                  }
                  if (local_a8 == (apx_valueTable_t *)0x0) {
                    if (self == (apx_attributeParser_t *)0x0) goto LAB_00123506;
                    self->last_error = 2;
                    self->error_next = puVar9;
                    iVar5 = 1;
                    bVar2 = false;
                    unaff_R15 = (uint8_t *)0x0;
                  }
                  else {
                    unaff_R15 = puVar9 + 1;
                    iVar5 = 1;
                    bVar2 = false;
                  }
                }
                else {
                  iVar5 = 0;
                  bVar2 = true;
                  if (*puVar9 == ',') {
                    puVar9 = puVar9 + 1;
                  }
                }
              }
              else {
                iVar5 = 3;
                bVar2 = false;
                puVar9 = (uint8_t *)0x0;
              }
            } while (iVar5 == 0);
            if (iVar5 == 3) {
LAB_001233d5:
              if (self->error_next == (uint8_t *)0x0) {
                if (self == (apx_attributeParser_t *)0x0) goto LAB_00123506;
                self->last_error = 3;
                self->error_next = puVar9;
              }
              attr = local_90;
              if (local_80.values.pDestructor != (_func_void_void_ptr *)0x0) {
                free(local_80.values.pDestructor);
                attr = local_90;
              }
            }
            else {
              attr = local_90;
              puVar3 = unaff_R15;
              if (bVar2) {
                puVar3 = puVar6;
              }
            }
          }
          else {
LAB_001233c9:
            local_a8 = (apx_valueTable_t *)0x0;
            puVar3 = (uint8_t *)0x0;
          }
        }
        else {
LAB_001233a3:
          local_a8 = (apx_valueTable_t *)0x0;
        }
LAB_00123436:
        unaff_R15 = puVar3;
        if (unaff_R15 <= puVar6) {
          local_a8 = (apx_valueTable_t *)0x0;
        }
      }
      else {
        if (uVar11 == 1) {
          if (end <= puVar6) goto LAB_001233a3;
          if (*puVar6 != '(') goto LAB_001233c9;
          puVar9 = puVar6 + 1;
          local_80.range.is_signed_range = false;
          local_80.range.lower = (anon_union_4_2_43a9a9ed_for_lower)0x0;
          local_80.range.upper = (anon_union_4_2_43a9a9ed_for_upper)0x0;
          local_80.num_count = 0;
          local_80.last_was_string = false;
          adt_ary_create(&local_80.values,adt_str_vdelete);
          local_a8 = (apx_valueTable_t *)0x0;
          local_88 = self;
          do {
            attr = local_90;
            if (end <= puVar9) goto LAB_00123436;
            pbVar7 = bstr_lstrip(puVar9,end);
            begin_00 = pbVar7;
            if (pbVar7 < end) {
              bVar1 = *pbVar7;
              if (local_80.last_was_string == false) {
                if ((ulong)bVar1 == 0x22) {
                  uVar10 = 2;
                  goto LAB_00122fda;
                }
                if (bVar1 != 0x2d) {
                  ppuVar8 = __ctype_b_loc();
                  uVar10 = (*ppuVar8)[bVar1] >> 0xb & 1;
                  goto LAB_00122fda;
                }
                begin_00 = pbVar7 + 1;
                unary_minus = true;
                uVar10 = 1;
              }
              else {
                uVar10 = (ushort)(bVar1 == 0x22) * 2;
LAB_00122fda:
                unary_minus = false;
              }
              if (uVar10 == 0) {
                pEnd = (byte *)0x0;
                begin_00 = (byte *)0x0;
              }
              else if (uVar10 == 2) {
                local_80.last_was_string = true;
                pEnd = bstr_match_pair(begin_00,end,'\"','\"','\\');
                if (begin_00 < pEnd) {
                  pElem = adt_str_new_bstr(begin_00 + 1,pEnd);
                  if (pElem == (adt_str_t *)0x0) {
                    if (local_88 == (apx_attributeParser_t *)0x0) goto LAB_00123506;
                    local_88->last_error = 2;
                    local_88->error_next = begin_00;
                  }
                  else {
                    adt_ary_push(&local_80.values,pElem);
                    begin_00 = pEnd + 1;
                  }
                  if (pElem == (adt_str_t *)0x0) {
                    begin_00 = (byte *)0x0;
                    self = local_88;
                    goto LAB_001230db;
                  }
                }
              }
              else {
                if (local_80.num_count == 1) {
                  pEnd = apx_attributeParser_parse_upper_limit
                                   (begin_00,end,unary_minus,&local_80.range);
                }
                else if (local_80.num_count == 0) {
                  pEnd = apx_attributeParser_parse_lower_limit
                                   (begin_00,end,unary_minus,&local_80.range);
                }
                else {
                  pEnd = (byte *)0x0;
                }
                if (begin_00 < pEnd) {
                  begin_00 = pEnd;
                }
                local_80.num_count = local_80.num_count + 1;
              }
              self = local_88;
              if (pEnd == (byte *)0x0) {
                if (local_88 == (apx_attributeParser_t *)0x0) goto LAB_00123506;
                local_88->last_error = 3;
                local_88->error_next = begin_00;
                begin_00 = (byte *)0x0;
              }
            }
LAB_001230db:
            if (pbVar7 < begin_00) {
              if (end < begin_00) {
                __assert_fail("result <= end",
                              "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                              ,0x367,
                              "const uint8_t *apx_attributeParser_parse_value_table(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_valueTable_t **)"
                             );
              }
              puVar9 = bstr_lstrip(begin_00,end);
              if (*puVar9 == ')') {
                local_a8 = apx_attributeParser_create_value_table_from_state(self,&local_80);
                if (local_a8 == (apx_valueTable_t *)0x0) {
                  self->error_next = puVar9;
                }
                unaff_R15 = puVar9 + 1;
                iVar5 = 1;
                bVar2 = false;
              }
              else {
                iVar5 = 0;
                bVar2 = true;
                if (*puVar9 == ',') {
                  puVar9 = puVar9 + 1;
                }
              }
            }
            else {
              iVar5 = 3;
              bVar2 = false;
              puVar9 = (uint8_t *)0x0;
            }
          } while (iVar5 == 0);
          attr = local_90;
          if ((iVar5 != 3) && (puVar3 = unaff_R15, bVar2)) {
            puVar3 = puVar6;
          }
          goto LAB_00123436;
        }
        if (self == (apx_attributeParser_t *)0x0) goto LAB_00123506;
        self->last_error = 3;
        self->error_next = puVar6;
        unaff_R15 = (uint8_t *)0x0;
        local_a8 = (apx_valueTable_t *)0x0;
      }
      if (puVar6 < unaff_R15) {
        if (end < unaff_R15) {
          __assert_fail("result <= end",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/attribute_parser.c"
                        ,0x246,
                        "const uint8_t *apx_attributeParser_parse_single_type_attribute(apx_attributeParser_t *, const uint8_t *, const uint8_t *, apx_typeAttributes_t *)"
                       );
        }
        if (local_a8 != (apx_valueTable_t *)0x0) {
          apx_typeAttributes_append_computation(attr,&local_a8->base);
        }
      }
      else {
        if (local_a8 != (apx_valueTable_t *)0x0) {
          apx_computation_vdelete(local_a8);
        }
        if (self == (apx_attributeParser_t *)0x0) goto LAB_00123506;
        self->last_error = 3;
        self->error_next = puVar6;
        unaff_R15 = (uint8_t *)0x0;
      }
      if ((begin < unaff_R15) && (begin = bstr_lstrip(unaff_R15,end), begin != end)) {
        if (*begin != ',') {
          if (self != (apx_attributeParser_t *)0x0) {
            self->last_error = 3;
            self->error_next = begin;
            begin = (uint8_t *)0x0;
            goto LAB_001234c5;
          }
          goto LAB_00123506;
        }
        begin = begin + 1;
        bVar2 = true;
      }
      else {
LAB_001234c5:
        bVar2 = false;
      }
      paVar4 = local_90;
    } while (bVar2);
  }
  return begin;
}

Assistant:

uint8_t const* apx_attributeParser_parse_type_attributes(apx_attributeParser_t* self, uint8_t const* begin, uint8_t const* end, apx_typeAttributes_t* attr)
{
   uint8_t const* next = begin;
   if ((end < begin) || (begin == NULL) || (end == NULL))
   {
      apx_attributeParser_set_error(self, APX_INVALID_ARGUMENT_ERROR, begin);
      return NULL;
   }
   while (next < end)
   {
      next = bstr_lstrip(next, end);
      if (next == end)
      {
         break;
      }
      uint8_t const* result = apx_attributeParser_parse_single_type_attribute(self, next, end, attr);
      if (result > next)
      {
         next = bstr_lstrip(result, end);
         if (next == end)
         {
            break;
         }
         if (*next == ',')
         {
            next++;
         }
         else
         {
            apx_attributeParser_set_error(self, APX_PARSE_ERROR, next);
            next = NULL;
            break;
         }
      }
      else
      {
         break;
      }
   }
   return next;
}